

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.h
# Opt level: O0

bool __thiscall Assimp::Q3Shader::ShaderDataBlock::operator==(ShaderDataBlock *this,string *o)

{
  int iVar1;
  string *o_local;
  ShaderDataBlock *this_local;
  
  iVar1 = ASSIMP_stricmp(o,&this->name);
  return (bool)((iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

bool operator== (const std::string& o) const {
        return !ASSIMP_stricmp(o,name);
    }